

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testC14N.c
# Opt level: O0

int test_c14n(char *xml_filename,int with_comments,int mode,char *xpath_filename,
             xmlChar **inclusive_namespaces)

{
  uint uVar1;
  undefined4 *puVar2;
  long lVar3;
  ssize_t sVar4;
  undefined8 local_60;
  void *pvStack_48;
  int ret;
  xmlChar *result;
  xmlXPathObjectPtr xpath;
  xmlDocPtr doc;
  xmlChar **inclusive_namespaces_local;
  char *xpath_filename_local;
  int mode_local;
  int with_comments_local;
  char *xml_filename_local;
  
  result = (xmlChar *)0x0;
  pvStack_48 = (void *)0x0;
  doc = (xmlDocPtr)inclusive_namespaces;
  inclusive_namespaces_local = (xmlChar **)xpath_filename;
  xpath_filename_local._0_4_ = mode;
  xpath_filename_local._4_4_ = with_comments;
  _mode_local = xml_filename;
  puVar2 = (undefined4 *)__xmlLoadExtDtdDefaultValue();
  *puVar2 = 6;
  xmlSubstituteEntitiesDefault(1);
  xpath = (xmlXPathObjectPtr)xmlReadFile(_mode_local,0,10);
  if (xpath == (xmlXPathObjectPtr)0x0) {
    fprintf(_stderr,"Error: unable to parse file \"%s\"\n",_mode_local);
    xml_filename_local._4_4_ = 0xffffffff;
  }
  else {
    lVar3 = xmlDocGetRootElement(xpath);
    if (lVar3 == 0) {
      fprintf(_stderr,"Error: empty document for file \"%s\"\n",_mode_local);
      xmlFreeDoc(xpath);
      xml_filename_local._4_4_ = 0xffffffff;
    }
    else if ((inclusive_namespaces_local == (xmlChar **)0x0) ||
            (result = (xmlChar *)
                      load_xpath_expr((xmlDocPtr)xpath,(char *)inclusive_namespaces_local),
            (xmlXPathObjectPtr)result != (xmlXPathObjectPtr)0x0)) {
      if (result == (xmlChar *)0x0) {
        local_60 = 0;
      }
      else {
        local_60 = *(undefined8 *)(result + 8);
      }
      uVar1 = xmlC14NDocDumpMemory
                        (xpath,local_60,(int)xpath_filename_local,doc,xpath_filename_local._4_4_,
                         &stack0xffffffffffffffb8);
      if ((int)uVar1 < 0) {
        fprintf(_stderr,"Error: failed to canonicalize XML file \"%s\" (ret=%d)\n",_mode_local,
                (ulong)uVar1);
        if (pvStack_48 != (void *)0x0) {
          (*_xmlFree)(pvStack_48);
        }
        xmlFreeDoc(xpath);
        xml_filename_local._4_4_ = 0xffffffff;
      }
      else {
        if (pvStack_48 != (void *)0x0) {
          sVar4 = write(1,pvStack_48,(long)(int)uVar1);
          if (sVar4 == -1) {
            fprintf(_stderr,"Can\'t write data\n");
          }
          (*_xmlFree)(pvStack_48);
        }
        if (result != (xmlChar *)0x0) {
          xmlXPathFreeObject(result);
        }
        xmlFreeDoc(xpath);
        xml_filename_local._4_4_ = uVar1;
      }
    }
    else {
      fprintf(_stderr,"Error: unable to evaluate xpath expression\n");
      xmlFreeDoc(xpath);
      xml_filename_local._4_4_ = 0xffffffff;
    }
  }
  return xml_filename_local._4_4_;
}

Assistant:

static int
test_c14n(const char* xml_filename, int with_comments, int mode,
	const char* xpath_filename, xmlChar **inclusive_namespaces) {
    xmlDocPtr doc;
    xmlXPathObjectPtr xpath = NULL;
    xmlChar *result = NULL;
    int ret;

    /*
     * build an XML tree from a the file; we need to add default
     * attributes and resolve all character and entities references
     */
    xmlLoadExtDtdDefaultValue = XML_DETECT_IDS | XML_COMPLETE_ATTRS;
    xmlSubstituteEntitiesDefault(1);

    doc = xmlReadFile(xml_filename, NULL, XML_PARSE_DTDATTR | XML_PARSE_NOENT);
    if (doc == NULL) {
	fprintf(stderr, "Error: unable to parse file \"%s\"\n", xml_filename);
	return(-1);
    }

    /*
     * Check the document is of the right kind
     */
    if(xmlDocGetRootElement(doc) == NULL) {
        fprintf(stderr,"Error: empty document for file \"%s\"\n", xml_filename);
	xmlFreeDoc(doc);
	return(-1);
    }

    /*
     * load xpath file if specified
     */
    if(xpath_filename) {
	xpath = load_xpath_expr(doc, xpath_filename);
	if(xpath == NULL) {
	    fprintf(stderr,"Error: unable to evaluate xpath expression\n");
	    xmlFreeDoc(doc);
	    return(-1);
	}
    }

    /*
     * Canonical form
     */
    /* fprintf(stderr,"File \"%s\" loaded: start canonization\n", xml_filename); */
    ret = xmlC14NDocDumpMemory(doc,
	    (xpath) ? xpath->nodesetval : NULL,
	    mode, inclusive_namespaces,
	    with_comments, &result);
    if(ret >= 0) {
	if(result != NULL) {
	    if (write(STDOUT_FILENO, result, ret) == -1) {
		fprintf(stderr, "Can't write data\n");
	    }
	    xmlFree(result);
	}
    } else {
	fprintf(stderr,"Error: failed to canonicalize XML file \"%s\" (ret=%d)\n", xml_filename, ret);
	if(result != NULL) xmlFree(result);
	xmlFreeDoc(doc);
	return(-1);
    }

    /*
     * Cleanup
     */
    if(xpath != NULL) xmlXPathFreeObject(xpath);
    xmlFreeDoc(doc);

    return(ret);
}